

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,PointerType *type)

{
  uint uVar1;
  Type *local_28;
  uint local_1c;
  
  uVar1 = Type::getAddressSpace(&type->super_Type);
  if (uVar1 == 0) {
    local_28 = PointerType::getElementType(type);
    append<LLVMBC::Type*,char_const(&)[2]>(this,&local_28,(char (*) [2])0x1a779e);
  }
  else {
    local_28 = PointerType::getElementType(type);
    local_1c = Type::getAddressSpace(&type->super_Type);
    append<LLVMBC::Type*,char_const(&)[12],unsigned_int,char_const(&)[3]>
              (this,&local_28,(char (*) [12])" addrspace(",&local_1c,(char (*) [3])")*");
  }
  return;
}

Assistant:

void StreamState::append(PointerType *type)
{
	if (type->getAddressSpace() != 0)
		append(type->getElementType(), " addrspace(", type->getAddressSpace(), ")*");
	else
		append(type->getElementType(), "*");
}